

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int codebook_decode_start(vorb *f,Codebook *c)

{
  byte bVar1;
  long in_RSI;
  Codebook *in_RDI;
  int n;
  int z;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = -1;
  if (*(char *)(in_RSI + 0x19) == '\0') {
    error((vorb *)in_RDI,VORBIS_invalid_stream);
  }
  else {
    if (*(int *)((long)in_RDI->fast_huffman + 0x6c8) < 10) {
      prep_huffman((vorb *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0));
    }
    iVar2 = (int)*(short *)(in_RSI + 0x30 +
                           (long)(int)(*(uint *)(in_RDI->fast_huffman + 0x362) & 0x3ff) * 2);
    if (iVar2 < 0) {
      iVar2 = codebook_decode_scalar_raw
                        ((vorb *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
    }
    else {
      bVar1 = *(byte *)(*(long *)(in_RSI + 8) + (long)iVar2);
      *(uint *)(in_RDI->fast_huffman + 0x362) =
           *(uint *)(in_RDI->fast_huffman + 0x362) >> (bVar1 & 0x1f);
      *(uint *)(in_RDI->fast_huffman + 0x364) = *(int *)(in_RDI->fast_huffman + 0x364) - (uint)bVar1
      ;
      if (*(int *)(in_RDI->fast_huffman + 0x364) < 0) {
        in_RDI->fast_huffman[0x364] = 0;
        in_RDI->fast_huffman[0x365] = 0;
        iVar2 = -1;
      }
    }
    if ((iVar2 < 0) &&
       (((char)in_RDI->fast_huffman[0x35a] != '\0' || (*(int *)(in_RDI->fast_huffman + 0x35e) == 0))
       )) {
      error((vorb *)in_RDI,VORBIS_invalid_stream);
    }
  }
  return iVar2;
}

Assistant:

static int codebook_decode_start(vorb *f, Codebook *c)
{
   int z = -1;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)
      error(f, VORBIS_invalid_stream);
   else {
      DECODE_VQ(z,f,c);
      if (c->sparse) assert(z < c->sorted_entries);
      if (z < 0) {  // check for EOP
         if (!f->bytes_in_seg)
            if (f->last_seg)
               return z;
         error(f, VORBIS_invalid_stream);
      }
   }
   return z;
}